

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O3

int jpc_ppxstab_insert(jpc_ppxstab_t *tab,jpc_ppxstabent_t *ent)

{
  uint uVar1;
  int iVar2;
  jpc_ppxstabent_t **ppjVar3;
  ulong uVar4;
  ulong uVar5;
  size_t num_elements;
  
  uVar1 = tab->numents;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    do {
      if (ent->ind < tab->ents[uVar5]->ind) goto LAB_0011e6c3;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
    uVar5 = (ulong)uVar1;
  }
LAB_0011e6c3:
  if (tab->maxents <= (int)uVar1) {
    num_elements = (long)tab->maxents + 0x80;
    if (tab->ents == (jpc_ppxstabent_t **)0x0) {
      ppjVar3 = (jpc_ppxstabent_t **)jas_alloc2(num_elements,8);
    }
    else {
      ppjVar3 = (jpc_ppxstabent_t **)jas_realloc2(tab->ents,num_elements,8);
    }
    if (ppjVar3 == (jpc_ppxstabent_t **)0x0) {
      return -1;
    }
    tab->ents = ppjVar3;
    tab->maxents = (int)num_elements;
    uVar4 = (ulong)(uint)tab->numents;
  }
  iVar2 = (int)uVar4;
  if ((int)uVar5 < iVar2) {
    uVar4 = (ulong)iVar2;
    do {
      tab->ents[uVar4] = tab->ents[uVar4 - 1];
      uVar4 = uVar4 - 1;
    } while ((long)(int)uVar5 < (long)uVar4);
  }
  tab->ents[(int)uVar4] = ent;
  tab->numents = iVar2 + 1;
  return 0;
}

Assistant:

static int jpc_ppxstab_insert(jpc_ppxstab_t *tab, jpc_ppxstabent_t *ent)
{
	int inspt;
	int i;

	for (i = 0; i < tab->numents; ++i) {
		if (tab->ents[i]->ind > ent->ind) {
			break;
		}
	}
	inspt = i;

	if (tab->numents >= tab->maxents) {
		if (jpc_ppxstab_grow(tab, tab->maxents + 128)) {
			return -1;
		}
	}

	for (i = tab->numents; i > inspt; --i) {
		tab->ents[i] = tab->ents[i - 1];
	}
	tab->ents[i] = ent;
	++tab->numents;

	return 0;
}